

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O3

UINT8 VGMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)

{
  UINT8 UVar1;
  UINT32 UVar2;
  int *piVar3;
  
  DataLoader_ReadUntil(dataLoader,0x38);
  UVar2 = DataLoader_GetSize(dataLoader);
  UVar1 = 0xf1;
  if (0x37 < UVar2) {
    piVar3 = (int *)DataLoader_GetData(dataLoader);
    UVar1 = (*piVar3 == 0x206d6756) * '\x10' + 0xf0;
  }
  return UVar1;
}

Assistant:

UINT8 VGMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)
{
	DataLoader_ReadUntil(dataLoader,0x38);
	if (DataLoader_GetSize(dataLoader) < 0x38)
		return 0xF1;	// file too small
	if (memcmp(&DataLoader_GetData(dataLoader)[0x00], "Vgm ", 4))
		return 0xF0;	// invalid signature
	return 0x00;
}